

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O2

void __thiscall
polyscope::render::backend_openGL_mock::GLShaderProgram::setUniform
          (GLShaderProgram *this,string *name,double val)

{
  pointer pGVar1;
  __type _Var2;
  invalid_argument *piVar3;
  pointer __lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  __lhs = (this->uniforms).
          super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pGVar1 = (this->uniforms).
           super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderProgram::GLShaderUniform>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (__lhs == pGVar1) {
      piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(&local_40,"Tried to set nonexistent uniform with name ",name);
      std::invalid_argument::invalid_argument(piVar3,(string *)&local_40);
      __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    _Var2 = std::operator==(&__lhs->name,name);
    if (_Var2) break;
    __lhs = __lhs + 1;
  }
  if (__lhs->type == Float) {
    __lhs->isSet = true;
    return;
  }
  piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar3,"Tried to set GLShaderUniform with wrong type");
  __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void GLShaderProgram::setUniform(std::string name, double val) {

  for (GLShaderUniform& u : uniforms) {
    if (u.name == name) {
      if (u.type == DataType::Float) {
        u.isSet = true;
      } else {
        throw std::invalid_argument("Tried to set GLShaderUniform with wrong type");
      }
      return;
    }
  }
  throw std::invalid_argument("Tried to set nonexistent uniform with name " + name);
}